

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::SchemaElement::SchemaElement(SchemaElement *this)

{
  *(undefined ***)this = &PTR__SchemaElement_004a6b88;
  this->type = BOOLEAN;
  this->type_length = 0;
  this->repetition_type = REQUIRED;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->num_children = 0;
  this->converted_type = UTF8;
  this->scale = 0;
  this->precision = 0;
  this->field_id = 0;
  LogicalType::LogicalType(&this->logicalType);
  this->__isset = (_SchemaElement__isset)((ushort)this->__isset & 0xfe00);
  return;
}

Assistant:

SchemaElement::SchemaElement() noexcept
   : type(static_cast<Type::type>(0)),
     type_length(0),
     repetition_type(static_cast<FieldRepetitionType::type>(0)),
     name(),
     num_children(0),
     converted_type(static_cast<ConvertedType::type>(0)),
     scale(0),
     precision(0),
     field_id(0) {
}